

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int hash_code(char *string)

{
  undefined1 auVar1 [16];
  unsigned_long h;
  long lVar2;
  
  h = 0;
  for (; lVar2 = (long)*string, lVar2 != 0; string = string + 1) {
    h = (h + lVar2 >> 2) + lVar2 + (h + lVar2) * 8;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = h;
  return SUB164(auVar1 % ZEXT816(0xfd),0);
}

Assistant:

static int
hash_code (const char *string)
{
  unsigned long c, h = 0;
  
  while ((c = *string++))
    {
      h += c;
      h = (h << 3) + (h >> 2) + c;
    }

  return (h % HASH_BUCKETS);
}